

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void dr_prediction_z1_64xN_avx2
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  long lVar1;
  uint8_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  ushort uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  ushort uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar17 [32];
  
  lVar1 = (long)N + 0x3f;
  uVar2 = above[(long)N + 0x3f];
  auVar16[1] = uVar2;
  auVar16[0] = uVar2;
  auVar16[2] = uVar2;
  auVar16[3] = uVar2;
  auVar16[4] = uVar2;
  auVar16[5] = uVar2;
  auVar16[6] = uVar2;
  auVar16[7] = uVar2;
  auVar16[8] = uVar2;
  auVar16[9] = uVar2;
  auVar16[10] = uVar2;
  auVar16[0xb] = uVar2;
  auVar16[0xc] = uVar2;
  auVar16[0xd] = uVar2;
  auVar16[0xe] = uVar2;
  auVar16[0xf] = uVar2;
  auVar17[0x10] = uVar2;
  auVar17._0_16_ = auVar16;
  auVar17[0x11] = uVar2;
  auVar17[0x12] = uVar2;
  auVar17[0x13] = uVar2;
  auVar17[0x14] = uVar2;
  auVar17[0x15] = uVar2;
  auVar17[0x16] = uVar2;
  auVar17[0x17] = uVar2;
  auVar17[0x18] = uVar2;
  auVar17[0x19] = uVar2;
  auVar17[0x1a] = uVar2;
  auVar17[0x1b] = uVar2;
  auVar17[0x1c] = uVar2;
  auVar17[0x1d] = uVar2;
  auVar17[0x1e] = uVar2;
  auVar17[0x1f] = uVar2;
  auVar18[0] = (undefined1)lVar1;
  auVar18[1] = auVar18[0];
  auVar18[2] = auVar18[0];
  auVar18[3] = auVar18[0];
  auVar18[4] = auVar18[0];
  auVar18[5] = auVar18[0];
  auVar18[6] = auVar18[0];
  auVar18[7] = auVar18[0];
  auVar18[8] = auVar18[0];
  auVar18[9] = auVar18[0];
  auVar18[10] = auVar18[0];
  auVar18[0xb] = auVar18[0];
  auVar18[0xc] = auVar18[0];
  auVar18[0xd] = auVar18[0];
  auVar18[0xe] = auVar18[0];
  auVar18[0xf] = auVar18[0];
  iVar12 = 0;
  iVar9 = N;
  if (N < 1) {
    iVar9 = iVar12;
  }
  auVar19._8_2_ = 0x10;
  auVar19._0_8_ = 0x10001000100010;
  auVar19._10_2_ = 0x10;
  auVar19._12_2_ = 0x10;
  auVar19._14_2_ = 0x10;
  auVar19._16_2_ = 0x10;
  auVar19._18_2_ = 0x10;
  auVar19._20_2_ = 0x10;
  auVar19._22_2_ = 0x10;
  auVar19._24_2_ = 0x10;
  auVar19._26_2_ = 0x10;
  auVar19._28_2_ = 0x10;
  auVar19._30_2_ = 0x10;
  uVar13 = upsample_above;
  while( true ) {
    if (iVar12 == iVar9) {
      return;
    }
    iVar10 = (int)uVar13 >> 6;
    iVar8 = N;
    if (iVar10 < (int)lVar1) {
      uVar7 = (ushort)(uVar13 >> 1);
      uVar20 = uVar7 & 0x1f;
      auVar21._0_8_ = CONCAT26(uVar7,CONCAT24(uVar7,CONCAT22(uVar7,uVar7))) & 0x1f001f001f001f;
      auVar21._8_2_ = uVar20;
      auVar21._10_2_ = uVar20;
      auVar21._12_2_ = uVar20;
      auVar21._14_2_ = uVar20;
      auVar21._16_2_ = uVar20;
      auVar21._18_2_ = uVar20;
      auVar21._20_2_ = uVar20;
      auVar21._22_2_ = uVar20;
      auVar21._24_2_ = uVar20;
      auVar21._26_2_ = uVar20;
      auVar21._28_2_ = uVar20;
      auVar21._30_2_ = uVar20;
      lVar15 = (long)iVar10;
      for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 0x10) {
        auVar3 = auVar16;
        if ((long)(lVar15 + uVar14) < lVar1) {
          auVar22 = vpmovzxbw_avx2(*(undefined1 (*) [16])(above + uVar14 + lVar15));
          auVar6 = vpmovzxbw_avx2(*(undefined1 (*) [16])(above + uVar14 + lVar15 + 1));
          auVar6 = vpsubw_avx2(auVar6,auVar22);
          auVar6 = vpmullw_avx2(auVar6,auVar21);
          auVar22 = vpsllw_avx2(auVar22,5);
          auVar22 = vpaddw_avx2(auVar22,auVar19);
          auVar22 = vpaddw_avx2(auVar6,auVar22);
          auVar22 = vpsrlw_avx2(auVar22,5);
          auVar3 = vpackuswb_avx(auVar22._0_16_,auVar22._16_16_);
          uVar11 = iVar10 + (int)uVar14;
          auVar23[0] = (undefined1)uVar11;
          auVar23[1] = auVar23[0];
          auVar23[2] = auVar23[0];
          auVar23[3] = auVar23[0];
          auVar23[4] = auVar23[0];
          auVar23[5] = auVar23[0];
          auVar23[6] = auVar23[0];
          auVar23[7] = auVar23[0];
          auVar23[8] = auVar23[0];
          auVar23[9] = auVar23[0];
          auVar23[10] = auVar23[0];
          auVar23[0xb] = auVar23[0];
          auVar23[0xc] = auVar23[0];
          auVar23[0xd] = auVar23[0];
          auVar23[0xe] = auVar23[0];
          auVar23[0xf] = auVar23[0];
          auVar4 = vpaddb_avx(auVar23,SUB6416(ZEXT464(0x7060504),0));
          auVar23 = vpaddb_avx(auVar23,ZEXT816(0xf0e0d0c0b0a0908));
          auVar5 = vpinsrb_avx(ZEXT416(uVar11),uVar11 + 1,1);
          auVar5 = vpinsrb_avx(auVar5,uVar11 + 2,2);
          auVar5 = vpinsrb_avx(auVar5,uVar11 + 3,3);
          auVar4 = vpunpckldq_avx(auVar5,auVar4);
          auVar4 = vpunpcklqdq_avx(auVar4,auVar23);
          auVar4 = vpsubusb_avx(auVar18,auVar4);
          auVar4 = vpcmpgtb_avx(auVar4,(undefined1  [16])0x0);
          auVar3 = vpblendvb_avx(auVar16,auVar3,auVar4);
        }
        *(undefined1 (*) [16])(*(undefined1 (*) [32])dst + uVar14) = auVar3;
      }
      uVar13 = uVar13 + upsample_above;
    }
    else {
      while (iVar8 != 0) {
        *(undefined1 (*) [32])dst = auVar17;
        *(undefined1 (*) [32])((long)dst + 0x20) = auVar17;
        dst = *(undefined1 (*) [32])dst + stride;
        iVar8 = iVar8 + -1;
      }
    }
    if ((int)lVar1 <= iVar10) break;
    iVar12 = iVar12 + 1;
    dst = *(undefined1 (*) [32])dst + stride;
    N = N + -1;
  }
  return;
}

Assistant:

static void dr_prediction_z1_64xN_avx2(int N, uint8_t *dst, ptrdiff_t stride,
                                       const uint8_t *above, int upsample_above,
                                       int dx) {
  // here upsample_above is 0 by design of av1_use_intra_edge_upsample
  (void)upsample_above;
  const int frac_bits = 6;
  const int max_base_x = ((64 + N) - 1);

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m256i a0, a1, a32, a16;
  __m256i a_mbase_x, diff, c3f;
  __m128i max_base_x128, base_inc128, mask128;

  a16 = _mm256_set1_epi16(16);
  a_mbase_x = _mm256_set1_epi8((int8_t)above[max_base_x]);
  max_base_x128 = _mm_set1_epi8(max_base_x);
  c3f = _mm256_set1_epi16(0x3f);

  int x = dx;
  for (int r = 0; r < N; r++, dst += stride) {
    __m256i b, res;
    int base = x >> frac_bits;
    if (base >= max_base_x) {
      for (int i = r; i < N; ++i) {
        _mm256_storeu_si256((__m256i *)dst, a_mbase_x);  // save 32 values
        _mm256_storeu_si256((__m256i *)(dst + 32), a_mbase_x);
        dst += stride;
      }
      return;
    }

    __m256i shift =
        _mm256_srli_epi16(_mm256_and_si256(_mm256_set1_epi16(x), c3f), 1);

    __m128i a0_128, a1_128, res128;
    for (int j = 0; j < 64; j += 16) {
      int mdif = max_base_x - (base + j);
      if (mdif <= 0) {
        _mm_storeu_si128((__m128i *)(dst + j),
                         _mm256_castsi256_si128(a_mbase_x));
      } else {
        a0_128 = _mm_loadu_si128((__m128i *)(above + base + j));
        a1_128 = _mm_loadu_si128((__m128i *)(above + base + 1 + j));
        a0 = _mm256_cvtepu8_epi16(a0_128);
        a1 = _mm256_cvtepu8_epi16(a1_128);

        diff = _mm256_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm256_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm256_add_epi16(a32, a16);  // a[x] * 32 + 16
        b = _mm256_mullo_epi16(diff, shift);

        res = _mm256_add_epi16(a32, b);
        res = _mm256_srli_epi16(res, 5);
        res = _mm256_packus_epi16(
            res, _mm256_castsi128_si256(
                     _mm256_extracti128_si256(res, 1)));  // 16 8bit values

        base_inc128 =
            _mm_setr_epi8((int8_t)(base + j), (int8_t)(base + j + 1),
                          (int8_t)(base + j + 2), (int8_t)(base + j + 3),
                          (int8_t)(base + j + 4), (int8_t)(base + j + 5),
                          (int8_t)(base + j + 6), (int8_t)(base + j + 7),
                          (int8_t)(base + j + 8), (int8_t)(base + j + 9),
                          (int8_t)(base + j + 10), (int8_t)(base + j + 11),
                          (int8_t)(base + j + 12), (int8_t)(base + j + 13),
                          (int8_t)(base + j + 14), (int8_t)(base + j + 15));

        mask128 = _mm_cmpgt_epi8(_mm_subs_epu8(max_base_x128, base_inc128),
                                 _mm_setzero_si128());
        res128 = _mm_blendv_epi8(_mm256_castsi256_si128(a_mbase_x),
                                 _mm256_castsi256_si128(res), mask128);
        _mm_storeu_si128((__m128i *)(dst + j), res128);
      }
    }
    x += dx;
  }
}